

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O2

char * __thiscall
glcts::TextureBufferActiveUniformValidationCS::getComputeShaderCode
          (TextureBufferActiveUniformValidationCS *this)

{
  return 
  "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nlayout(r32f)  uniform highp imageBuffer    image_buffer;\nlayout(r32i)  uniform highp iimageBuffer   iimage_buffer;\nlayout(r32ui) uniform highp uimageBuffer   uimage_buffer;\n\nlayout (local_size_x = 1) in;\n\nvoid main(void)\n{\n    imageStore(image_buffer,  0, vec4 (1.0, 1.0, 1.0, 1.0));\n    imageStore(iimage_buffer, 0, ivec4(1,   1,   1,   1)  );\n    imageStore(uimage_buffer, 0, uvec4(1,   1,   1,   1)  );\n}\n"
  ;
}

Assistant:

const char* TextureBufferActiveUniformValidationCS::getComputeShaderCode() const
{
	const char* result = "${VERSION}\n"
						 "\n"
						 "${TEXTURE_BUFFER_REQUIRE}\n"
						 "\n"
						 "precision highp float;\n"
						 "\n"
						 "layout(r32f)  uniform highp imageBuffer    image_buffer;\n"
						 "layout(r32i)  uniform highp iimageBuffer   iimage_buffer;\n"
						 "layout(r32ui) uniform highp uimageBuffer   uimage_buffer;\n"
						 "\n"
						 "layout (local_size_x = 1) in;\n"
						 "\n"
						 "void main(void)\n"
						 "{\n"
						 "    imageStore(image_buffer,  0, vec4 (1.0, 1.0, 1.0, 1.0));\n"
						 "    imageStore(iimage_buffer, 0, ivec4(1,   1,   1,   1)  );\n"
						 "    imageStore(uimage_buffer, 0, uvec4(1,   1,   1,   1)  );\n"
						 "}\n";

	return result;
}